

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall Imf_2_5::anon_unknown_17::LineCompositeTask::execute(LineCompositeTask *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float i;
  Data *pDVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar6;
  bool bVar7;
  short sVar8;
  long lVar9;
  iterator iVar10;
  Iterator IVar11;
  pointer ppcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Iterator tmp;
  vector<const_float_*,_std::allocator<const_float_*>_> inputs;
  vector<float,_std::allocator<float>_> output_pixel;
  long local_98;
  DeepCompositing local_88;
  vector<const_float_*,_std::allocator<const_float_*>_> local_80;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *local_68;
  vector<float,_std::allocator<float>_> local_60;
  DeepCompositing *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  iVar1 = this->_y;
  iVar2 = this->_start;
  pDVar5 = this->_Data;
  pvVar6 = this->_names;
  local_68 = this->_pointers;
  local_38 = this->_total_sizes;
  local_40 = this->_num_sources;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_60,
             (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_80);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            (&local_80,
             (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_88);
  DeepCompositing::DeepCompositing(&local_88);
  local_48 = &local_88;
  if (pDVar5->_comp != (DeepCompositing *)0x0) {
    local_48 = pDVar5->_comp;
  }
  iVar3 = (pDVar5->_dataWindow).min.x;
  iVar4 = (pDVar5->_dataWindow).max.x;
  if (iVar3 <= iVar4) {
    lVar15 = (long)((iVar1 - iVar2) * ((iVar4 - iVar3) + 1));
    local_98 = (long)iVar3;
    do {
      if (pDVar5->_zback == true) {
        ppcVar12 = (pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        if ((pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish == ppcVar12) {
          uVar14 = 0;
        }
        else {
          lVar9 = 0;
          uVar13 = 0;
          do {
            local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13] =
                 *(float **)
                  (*(long *)(*(long *)&(((local_68->
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar9) + lVar15 * 8);
            uVar13 = uVar13 + 1;
            ppcVar12 = (pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12;
            lVar9 = lVar9 + 0x18;
          } while (uVar13 < (ulong)((long)uVar14 >> 3));
        }
      }
      else {
        *local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
         super__Vector_impl_data._M_start =
             *(float **)
              (**(long **)&(((local_68->
                             super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           )._M_impl.super__Vector_impl_data + lVar15 * 8);
        local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
        super__Vector_impl_data._M_start[1] =
             *(float **)
              (**(long **)&(((local_68->
                             super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                           )._M_impl.super__Vector_impl_data + lVar15 * 8);
        ppcVar12 = (pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        uVar14 = (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12;
        if (0x10 < uVar14) {
          uVar13 = 2;
          lVar9 = 6;
          do {
            local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13] =
                 *(float **)
                  (*(long *)(*(long *)&(((local_68->
                                         super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar9 * 8) + lVar15 * 8);
            uVar13 = uVar13 + 1;
            ppcVar12 = (pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(pvVar6->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar12;
            lVar9 = lVar9 + 3;
          } while (uVar13 < (ulong)((long)uVar14 >> 3));
        }
      }
      (*local_48->_vptr_DeepCompositing[2])
                (local_48,local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                 local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                 super__Vector_impl_data._M_start,ppcVar12,uVar14 >> 3,
                 (ulong)(local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar15],
                 (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[lVar15]);
      iVar10._M_node = (_Base_ptr)FrameBuffer::begin(&pDVar5->_outputFrameBuffer);
      lVar9 = 0;
      while (IVar11 = FrameBuffer::end(&pDVar5->_outputFrameBuffer),
            (iterator)iVar10._M_node != IVar11._i._M_node) {
        i = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start
            [*(int *)((long)(pDVar5->_bufferMap).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar9)];
        if (iVar10._M_node[9]._M_color == _S_black) {
          if ((i != 0.0) || (NAN(i))) {
            if (half::_eLut[(uint)i >> 0x17] == 0) {
              sVar8 = half::convert((int)i);
            }
            else {
              sVar8 = half::_eLut[(uint)i >> 0x17] +
                      (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >>
                             0xd);
            }
          }
          else {
            sVar8 = (short)((uint)i >> 0x10);
          }
          *(short *)((long)&(iVar10._M_node[9]._M_parent)->_M_color +
                    (long)iVar10._M_node[9]._M_left * local_98 +
                    (long)iVar10._M_node[9]._M_right * (long)iVar1) = sVar8;
        }
        else if (iVar10._M_node[9]._M_color == 2) {
          *(float *)((long)&(iVar10._M_node[9]._M_parent)->_M_color +
                    (long)iVar10._M_node[9]._M_left * local_98 +
                    (long)iVar10._M_node[9]._M_right * (long)iVar1) = i;
        }
        iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
        lVar9 = lVar9 + 4;
      }
      lVar15 = lVar15 + 1;
      bVar7 = local_98 < (pDVar5->_dataWindow).max.x;
      local_98 = local_98 + 1;
    } while (bVar7);
  }
  DeepCompositing::~DeepCompositing(&local_88);
  if (local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<const_float_*,_std::allocator<const_float_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LineCompositeTask::execute()
{
  composite_line(_y,_start,_Data,*_names,*_pointers,*_total_sizes,*_num_sources);
}